

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

CURLcode Curl_getformdata(Curl_easy *data,FormData **finalform,curl_httppost *post,
                         char *custom_content_type,curl_off_t *sizep)

{
  curl_slist *pcVar1;
  ulong uVar2;
  byte *__filename;
  CURLcode CVar3;
  CURLcode CVar4;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  size_t length;
  char *pcVar7;
  curl_off_t *pcVar8;
  curl_off_t length_00;
  size_t buflen;
  curl_httppost *pcVar9;
  curl_slist **ppcVar10;
  formtype type;
  curl_httppost *file;
  curl_off_t size;
  FormData *form;
  FormData **local_2d0;
  Curl_easy *local_2c8;
  curl_off_t *local_2c0;
  curl_off_t *local_2b8;
  curl_off_t *local_2b0;
  FormData *local_2a8;
  FormData *firstform;
  char boundary [42];
  char fileboundary [42];
  char buffer [512];
  
  form = (FormData *)0x0;
  size = 0;
  *finalform = (FormData *)0x0;
  if (post == (curl_httppost *)0x0) {
    CVar3 = CURLE_OK;
  }
  else {
    formboundary(data,boundary,(size_t)post);
    pcVar7 = "Content-Type: multipart/form-data";
    if (custom_content_type != (char *)0x0) {
      pcVar7 = custom_content_type;
    }
    CVar3 = AddFormDataf(&form,(curl_off_t *)0x0,"%s; boundary=%s\r\n",pcVar7,boundary);
    if (CVar3 == CURLE_OK) {
      local_2a8 = form;
      firstform = form;
      local_2d0 = finalform;
      local_2c8 = data;
      do {
        if (((((size != 0) && (CVar4 = AddFormDataf(&form,&size,"\r\n"), CVar4 != CURLE_OK)) ||
             (CVar4 = AddFormDataf(&form,&size,"--%s\r\n",boundary), CVar4 != CURLE_OK)) ||
            ((CVar4 = AddFormDataf(&form,&size,"Content-Disposition: form-data; name=\""),
             CVar4 != CURLE_OK ||
             (CVar4 = AddFormData(&form,FORM_DATA,post->name,post->namelength,&size),
             CVar4 != CURLE_OK)))) || (CVar4 = AddFormDataf(&form,&size,"\""), CVar4 != CURLE_OK))
        goto LAB_00522073;
        if (post->more != (curl_httppost *)0x0) {
          formboundary(local_2c8,fileboundary,buflen);
          CVar4 = AddFormDataf(&form,&size,"\r\nContent-Type: multipart/mixed; boundary=%s\r\n",
                               fileboundary);
          if (CVar4 != CURLE_OK) goto LAB_00522073;
        }
        local_2b0 = &post->contentlen;
        local_2b8 = &post->contentslength;
        pcVar9 = post;
        local_2c0 = sizep;
        do {
          if (post->more == (curl_httppost *)0x0) {
            if (((post->flags & 0x51U) != 0) &&
               ((file = post, (post->flags & 1U) != 0 || (post->showfilename != (char *)0x0))))
            goto LAB_00521de5;
          }
          else {
            CVar4 = AddFormDataf(&form,&size,"\r\n--%s\r\nContent-Disposition: attachment",
                                 fileboundary);
            file = pcVar9;
            if (CVar4 != CURLE_OK) goto LAB_00522073;
LAB_00521de5:
            CVar4 = formdata_add_filename(file,&form,&size);
            if (CVar4 != CURLE_OK) goto LAB_00522073;
          }
          if ((pcVar9->contenttype != (char *)0x0) &&
             (CVar4 = AddFormDataf(&form,&size,"\r\nContent-Type: %s"), CVar4 != CURLE_OK))
          goto LAB_00522073;
          ppcVar10 = &pcVar9->contentheader;
          while (pcVar1 = *ppcVar10, pcVar1 != (curl_slist *)0x0) {
            CVar4 = AddFormDataf(&form,&size,"\r\n%s");
            ppcVar10 = &pcVar1->next;
            if (CVar4 != CURLE_OK) goto LAB_00522073;
          }
          CVar4 = AddFormDataf(&form,&size,"\r\n\r\n");
          if (CVar4 != CURLE_OK) goto LAB_00522073;
          uVar2 = post->flags;
          if ((uVar2 & 3) == 0) {
            if ((uVar2 & 0x10) == 0) {
              pcVar8 = local_2b0;
              if (-1 < (char)uVar2) {
                pcVar8 = local_2b8;
              }
              length_00 = *pcVar8;
              if ((uVar2 & 0x40) != 0) {
                pcVar7 = (char *)post->userp;
                type = FORM_CALLBACK;
                goto LAB_00521fe0;
              }
              pcVar7 = post->contents;
            }
            else {
              pcVar7 = post->buffer;
              length_00 = post->bufferlength;
            }
            type = FORM_CONTENT;
LAB_00521fe0:
            CVar4 = AddFormData(&form,type,pcVar7,length_00,&size);
          }
          else {
            __filename = (byte *)pcVar9->contents;
            uVar5 = *__filename - 0x2d;
            if (uVar5 == 0) {
              uVar5 = (uint)__filename[1];
            }
            __stream = _stdin;
            if (uVar5 != 0) {
              __stream = fopen64((char *)__filename,"rb");
            }
            if (__stream == (FILE *)0x0) {
              if (local_2c8 != (Curl_easy *)0x0) {
                Curl_failf(local_2c8,"couldn\'t open file \"%s\"",pcVar9->contents);
              }
              *local_2d0 = (FormData *)0x0;
              CVar4 = CURLE_READ_ERROR;
            }
            else {
              if (__stream != _stdin) {
                fclose(__stream);
                pcVar7 = pcVar9->contents;
                type = FORM_FILE;
                length_00 = 0;
                goto LAB_00521fe0;
              }
              do {
                length = fread(buffer,1,0x200,__stream);
                CVar3 = CURLE_OK;
                CVar4 = CVar3;
                if (((length == 0) ||
                    (CVar4 = AddFormData(&form,FORM_CONTENT,buffer,length,&size), CVar4 != CURLE_OK)
                    ) || (iVar6 = feof(__stream), CVar4 = CVar3, iVar6 != 0)) break;
                iVar6 = ferror(__stream);
              } while (iVar6 == 0);
            }
          }
        } while ((CVar4 == CURLE_OK) && (pcVar9 = pcVar9->more, pcVar9 != (curl_httppost *)0x0));
        if ((CVar4 != CURLE_OK) ||
           ((post->more != (curl_httppost *)0x0 &&
            (CVar4 = AddFormDataf(&form,&size,"\r\n--%s--",fileboundary), CVar4 != CURLE_OK))))
        goto LAB_00522073;
        pcVar8 = local_2c0;
        post = post->next;
        sizep = local_2c0;
      } while (post != (curl_httppost *)0x0);
      CVar3 = CURLE_OK;
      CVar4 = AddFormDataf(&form,&size,"\r\n--%s--\r\n",boundary);
      if (CVar4 == CURLE_OK) {
        *pcVar8 = size;
        *local_2d0 = local_2a8;
      }
      else {
LAB_00522073:
        CVar3 = CVar4;
        Curl_formclean(&firstform);
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_getformdata(struct Curl_easy *data,
                          struct FormData **finalform,
                          struct curl_httppost *post,
                          const char *custom_content_type,
                          curl_off_t *sizep)
{
  struct FormData *form = NULL;
  struct FormData *firstform;
  struct curl_httppost *file;
  CURLcode result = CURLE_OK;
  curl_off_t size = 0; /* support potentially ENORMOUS formposts */
  char fileboundary[42];
  struct curl_slist *curList;
  char boundary[42];

  *finalform = NULL; /* default form is empty */

  if(!post)
    return result; /* no input => no output! */

  result = formboundary(data, boundary, sizeof(boundary));
  if(result)
    return result;

  /* Make the first line of the output */
  result = AddFormDataf(&form, NULL,
                        "%s; boundary=%s\r\n",
                        custom_content_type?custom_content_type:
                        "Content-Type: multipart/form-data",
                        boundary);

  if(result) {
    return result;
  }
  /* we DO NOT include that line in the total size of the POST, since it'll be
     part of the header! */

  firstform = form;

  do {

    if(size) {
      result = AddFormDataf(&form, &size, "\r\n");
      if(result)
        break;
    }

    /* boundary */
    result = AddFormDataf(&form, &size, "--%s\r\n", boundary);
    if(result)
      break;

    /* Maybe later this should be disabled when a custom_content_type is
       passed, since Content-Disposition is not meaningful for all multipart
       types.
    */
    result = AddFormDataf(&form, &size,
                          "Content-Disposition: form-data; name=\"");
    if(result)
      break;

    result = AddFormData(&form, FORM_DATA, post->name, post->namelength,
                         &size);
    if(result)
      break;

    result = AddFormDataf(&form, &size, "\"");
    if(result)
      break;

    if(post->more) {
      /* If used, this is a link to more file names, we must then do
         the magic to include several files with the same field name */

      result = formboundary(data, fileboundary, sizeof(fileboundary));
      if(result) {
        break;
      }

      result = AddFormDataf(&form, &size,
                            "\r\nContent-Type: multipart/mixed;"
                            " boundary=%s\r\n",
                            fileboundary);
      if(result)
        break;
    }

    file = post;

    do {

      /* If 'showfilename' is set, that is a faked name passed on to us
         to use to in the formpost. If that is not set, the actually used
         local file name should be added. */

      if(post->more) {
        /* if multiple-file */
        result = AddFormDataf(&form, &size,
                              "\r\n--%s\r\nContent-Disposition: "
                              "attachment",
                              fileboundary);
        if(result)
          break;
        result = formdata_add_filename(file, &form, &size);
        if(result)
          break;
      }
      else if(post->flags & (HTTPPOST_FILENAME|HTTPPOST_BUFFER|
                             HTTPPOST_CALLBACK)) {
        /* it should be noted that for the HTTPPOST_FILENAME and
           HTTPPOST_CALLBACK cases the ->showfilename struct member is always
           assigned at this point */
        if(post->showfilename || (post->flags & HTTPPOST_FILENAME)) {
          result = formdata_add_filename(post, &form, &size);
        }

        if(result)
          break;
      }

      if(file->contenttype) {
        /* we have a specified type */
        result = AddFormDataf(&form, &size,
                              "\r\nContent-Type: %s",
                              file->contenttype);
        if(result)
          break;
      }

      curList = file->contentheader;
      while(curList) {
        /* Process the additional headers specified for this form */
        result = AddFormDataf(&form, &size, "\r\n%s", curList->data);
        if(result)
          break;
        curList = curList->next;
      }
      if(result)
        break;

      result = AddFormDataf(&form, &size, "\r\n\r\n");
      if(result)
        break;

      if((post->flags & HTTPPOST_FILENAME) ||
         (post->flags & HTTPPOST_READFILE)) {
        /* we should include the contents from the specified file */
        FILE *fileread;

        fileread = !strcmp("-", file->contents)?
          stdin:fopen(file->contents, "rb"); /* binary read for win32  */

        /*
         * VMS: This only allows for stream files on VMS.  Stream files are
         * OK, as are FIXED & VAR files WITHOUT implied CC For implied CC,
         * every record needs to have a \n appended & 1 added to SIZE
         */

        if(fileread) {
          if(fileread != stdin) {
            /* close the file */
            fclose(fileread);
            /* add the file name only - for later reading from this */
            result = AddFormData(&form, FORM_FILE, file->contents, 0, &size);
          }
          else {
            /* When uploading from stdin, we can't know the size of the file,
             * thus must read the full file as before. We *could* use chunked
             * transfer-encoding, but that only works for HTTP 1.1 and we
             * can't be sure we work with such a server.
             */
            size_t nread;
            char buffer[512];
            while((nread = fread(buffer, 1, sizeof(buffer), fileread)) != 0) {
              result = AddFormData(&form, FORM_CONTENT, buffer, nread, &size);
              if(result || feof(fileread) || ferror(fileread))
                break;
            }
          }
        }
        else {
          if(data)
            failf(data, "couldn't open file \"%s\"", file->contents);
          *finalform = NULL;
          result = CURLE_READ_ERROR;
        }
      }
      else if(post->flags & HTTPPOST_BUFFER)
        /* include contents of buffer */
        result = AddFormData(&form, FORM_CONTENT, post->buffer,
                             post->bufferlength, &size);
      else if(post->flags & HTTPPOST_CALLBACK)
        /* the contents should be read with the callback and the size is set
           with the contentslength */
        result = AddFormData(&form, FORM_CALLBACK, post->userp,
                             post->flags&CURL_HTTPPOST_LARGE?
                             post->contentlen:post->contentslength, &size);
      else
        /* include the contents we got */
        result = AddFormData(&form, FORM_CONTENT, post->contents,
                             post->flags&CURL_HTTPPOST_LARGE?
                             post->contentlen:post->contentslength, &size);
      file = file->more;
    } while(file && !result); /* for each specified file for this field */

    if(result)
      break;

    if(post->more) {
      /* this was a multiple-file inclusion, make a termination file
         boundary: */
      result = AddFormDataf(&form, &size,
                           "\r\n--%s--",
                           fileboundary);
      if(result)
        break;
    }
    post = post->next;
  } while(post); /* for each field */

  /* end-boundary for everything */
  if(!result)
    result = AddFormDataf(&form, &size, "\r\n--%s--\r\n", boundary);

  if(result) {
    Curl_formclean(&firstform);
    return result;
  }

  *sizep = size;
  *finalform = firstform;

  return result;
}